

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# NonMaximumSuppression.pb.h
# Opt level: O2

NonMaximumSuppression_PickTop * __thiscall
CoreML::Specification::NonMaximumSuppression::mutable_picktop(NonMaximumSuppression *this)

{
  NonMaximumSuppression_PickTop *this_00;
  
  if (this->_oneof_case_[0] == 1) {
    this_00 = (this->SuppressionMethod_).picktop_;
  }
  else {
    clear_SuppressionMethod(this);
    this->_oneof_case_[0] = 1;
    this_00 = (NonMaximumSuppression_PickTop *)operator_new(0x18);
    NonMaximumSuppression_PickTop::NonMaximumSuppression_PickTop(this_00);
    (this->SuppressionMethod_).picktop_ = this_00;
  }
  return this_00;
}

Assistant:

inline ::CoreML::Specification::NonMaximumSuppression_PickTop* NonMaximumSuppression::mutable_picktop() {
  if (!has_picktop()) {
    clear_SuppressionMethod();
    set_has_picktop();
    SuppressionMethod_.picktop_ = new ::CoreML::Specification::NonMaximumSuppression_PickTop;
  }
  // @@protoc_insertion_point(field_mutable:CoreML.Specification.NonMaximumSuppression.pickTop)
  return SuppressionMethod_.picktop_;
}